

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

int __thiscall
glcts::MissingQualifierTestGroup::init(MissingQualifierTestGroup *this,EVP_PKEY_CTX *ctx)

{
  MissingCase *this_00;
  MissingQualifierTestGroup *pMVar1;
  char *local_40;
  char *qualifier;
  int i;
  MissingQualifierTestGroup *this_local;
  
  qualifier._4_4_ = 0;
  pMVar1 = this;
  while ((int)qualifier._4_4_ < 0xf) {
    if (this->m_missingType == MISSING) {
      local_40 = (char *)0x0;
    }
    else {
      local_40 = GetLayoutQualifierStr
                           (*(GLenum *)(s_modes + (long)((int)(qualifier._4_4_ + 1) % 0xf) * 4));
    }
    this_00 = (MissingCase *)operator_new(0x88);
    MissingCase::MissingCase
              (this_00,(this->super_TestCaseGroup).m_context,this->m_glslVersion,
               *(GLenum *)(s_modes + (long)(int)qualifier._4_4_ * 4),local_40);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    qualifier._4_4_ = qualifier._4_4_ + 1;
    pMVar1 = (MissingQualifierTestGroup *)(ulong)qualifier._4_4_;
  }
  return (int)pMVar1;
}

Assistant:

void init(void)
	{
		// Pump individual modes.
		for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_modes); i++)
		{
			const char* qualifier = m_missingType == MISSING ?
										DE_NULL :
										GetLayoutQualifierStr(s_modes[(i + 1) % DE_LENGTH_OF_ARRAY(s_modes)]);
			addChild(new MissingCase(m_context, m_glslVersion, s_modes[i], qualifier));
		}
	}